

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack31_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  
  auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in + 1));
  auVar9 = vpmovsxbd_avx512f(_DAT_001949e0);
  uVar1 = *in;
  uVar2 = in[0x17];
  *out = uVar1 & 0x7fffffff;
  uVar3 = *(ulong *)(in + 0x15);
  auVar9 = vpermi2d_avx512f(auVar9,auVar8,ZEXT464(uVar1));
  auVar10 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
  auVar8 = vpshldvd_avx512_vbmi2(auVar8,auVar9,_DAT_001a43c0);
  auVar6 = *(undefined1 (*) [16])(in + 0xd);
  auVar8 = vpandd_avx512f(auVar8,auVar10);
  auVar8 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])(out + 1) = auVar8;
  auVar7 = *(undefined1 (*) [16])(in + 0x11);
  auVar6 = vpalignr_avx(auVar7,auVar6,0xc);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar4 = vpalignr_avx(auVar11,auVar7,0xc);
  auVar6 = vpshldvd_avx512_vbmi2(auVar7,auVar6,_DAT_001a1190);
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001a1410);
  auVar6 = vpand_avx(auVar6,auVar10._0_16_);
  auVar7 = vpsllvd_avx2(auVar11,_DAT_00195840);
  auVar5._8_8_ = 0x7fc000007fe00000;
  auVar5._0_8_ = 0x7fc000007fe00000;
  auVar7 = vpternlogq_avx512vl(auVar7,auVar4,auVar5,0xec);
  *(undefined1 (*) [16])(out + 0x11) = auVar6;
  *(long *)(out + 0x15) = auVar7._0_8_;
  out[0x17] = (uVar2 & 0xff) << 0x17 | (uint)(uVar3 >> 0x29);
  return in + 0x18;
}

Assistant:

const uint32_t *__fastunpack31_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 31);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 30)) << (31 - 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 29)) << (31 - 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 28)) << (31 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 27)) << (31 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 26)) << (31 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 25)) << (31 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 24)) << (31 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 23)) << (31 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 22)) << (31 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 21)) << (31 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 20)) << (31 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 19)) << (31 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 18)) << (31 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 17)) << (31 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 16)) << (31 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 15)) << (31 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 14)) << (31 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 13)) << (31 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 12)) << (31 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 11)) << (31 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 10)) << (31 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 9)) << (31 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 8)) << (31 - 8);
  out++;

  return in + 1;
}